

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxRowRatio(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  uint *puVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar5;
  Real a;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Item *pIVar10;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  double local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f0;
  long local_e8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_e0;
  Item *local_d8;
  long local_d0;
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [4];
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  local_e0 = this;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_170 = *(double *)(in_FS_OFFSET + -8);
    local_e8 = 0;
    local_f0 = lp;
    do {
      pIVar10 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[local_e8].idx;
      ::soplex::infinity::__tls_init();
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems._24_5_ = 0;
      local_168.data._M_elems[7]._1_3_ = 0;
      local_168.data._M_elems._32_5_ = 0;
      local_168.data._M_elems[9]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_168,local_170);
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems._24_5_ = 0;
      local_128.data._M_elems[7]._1_3_ = 0;
      local_128.data._M_elems._32_5_ = 0;
      local_128.data._M_elems[9]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
      if (0 < (pIVar10->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar9 = 0x34;
        lVar8 = 0;
        local_d8 = pIVar10;
        do {
          pNVar4 = (pIVar10->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          local_1e8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar9 + -0x14);
          puVar1 = (uint *)((long)&(pNVar4->val).m_backend.data + lVar9 + -0x34);
          local_1e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_1e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pNVar4->val).m_backend.data + lVar9 + -0x24);
          local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          iVar7 = *(int *)((long)&(pNVar4->val).m_backend.data + lVar9 + -0xc);
          local_1e8.neg = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar9 + -8);
          fVar2 = *(fpclass_type *)((long)&(pNVar4->val).m_backend.data + lVar9 + -4);
          iVar3 = *(int32_t *)((long)&(pNVar4->val).m_backend.data + lVar9);
          local_1e8.prec_elem = iVar3;
          local_1e8.fpclass = fVar2;
          if ((local_1e8.neg == true) &&
             (local_1e8.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_1e8.neg = false;
          }
          bVar5 = local_1e8.neg;
          this_00 = (local_e0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (local_e0->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          local_1e8.exp = iVar7;
          local_d0 = lVar8;
          local_c8 = (uint  [2])local_1e8.data._M_elems._0_8_;
          auStack_c0 = (uint  [2])local_1e8.data._M_elems._8_8_;
          local_b8 = (uint  [2])local_1e8.data._M_elems._16_8_;
          auStack_b0 = (uint  [2])local_1e8.data._M_elems._24_8_;
          local_a8._0_8_ = local_1e8.data._M_elems._32_8_;
          local_58 = (uint  [2])local_1e8.data._M_elems._0_8_;
          auStack_50 = (uint  [2])local_1e8.data._M_elems._8_8_;
          local_48 = (uint  [2])local_1e8.data._M_elems._16_8_;
          auStack_40 = (uint  [2])local_1e8.data._M_elems._24_8_;
          local_38 = (uint  [2])local_1e8.data._M_elems._32_8_;
          a = Tolerances::epsilon(this_00);
          local_98.data._M_elems[8] = local_38[0];
          local_98.data._M_elems[9] = local_38[1];
          local_98.data._M_elems[4] = local_48[0];
          local_98.data._M_elems[5] = local_48[1];
          local_98.data._M_elems[6] = auStack_40[0];
          local_98.data._M_elems[7] = auStack_40[1];
          local_98.data._M_elems[0] = local_58[0];
          local_98.data._M_elems[1] = local_58[1];
          uVar6 = local_98.data._M_elems._0_8_;
          local_98.data._M_elems[2] = auStack_50[0];
          local_98.data._M_elems[3] = auStack_50[1];
          local_98.neg = bVar5;
          local_98.prec_elem = iVar3;
          local_98.fpclass = fVar2;
          if ((bVar5 != false) &&
             (local_98.data._M_elems[0] = local_58[0],
             local_98.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_98.neg = (bool)(bVar5 ^ 1);
          }
          bVar5 = false;
          local_98.data._M_elems._0_8_ = uVar6;
          local_98.exp = iVar7;
          if ((fVar2 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_1a8.fpclass = cpp_dec_float_finite;
            local_1a8.prec_elem = 10;
            local_1a8.data._M_elems[0] = 0;
            local_1a8.data._M_elems[1] = 0;
            local_1a8.data._M_elems[2] = 0;
            local_1a8.data._M_elems[3] = 0;
            local_1a8.data._M_elems[4] = 0;
            local_1a8.data._M_elems[5] = 0;
            local_1a8.data._M_elems._24_5_ = 0;
            local_1a8.data._M_elems[7]._1_3_ = 0;
            local_1a8.data._M_elems._32_5_ = 0;
            local_1a8.data._M_elems[9]._1_3_ = 0;
            local_1a8.exp = 0;
            local_1a8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1a8,a);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_98,&local_1a8);
            bVar5 = iVar7 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          lVar8 = local_d0;
          pIVar10 = local_d8;
          if (!bVar5) {
            if (((local_1e8.fpclass != cpp_dec_float_NaN) &&
                (local_168.fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1e8,&local_168), iVar7 < 0)) {
              local_168.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_168.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_168.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_168.exp = local_1e8.exp;
              local_168.neg = local_1e8.neg;
              local_168.fpclass = local_1e8.fpclass;
              local_168.prec_elem = local_1e8.prec_elem;
            }
            if (((local_1e8.fpclass != cpp_dec_float_NaN) &&
                (local_128.fpclass != cpp_dec_float_NaN)) &&
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1e8,&local_128), 0 < iVar7)) {
              local_128.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
              local_128.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
              local_128.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_128.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_128.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_128.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_128.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_128.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_128.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_128.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_128.exp = local_1e8.exp;
              local_128.neg = local_1e8.neg;
              local_128.fpclass = local_1e8.fpclass;
              local_128.prec_elem = local_1e8.prec_elem;
            }
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x3c;
        } while (lVar8 < (pIVar10->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
      ::soplex::infinity::__tls_init();
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 10;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems._24_5_ = 0;
      local_1a8.data._M_elems[7]._1_3_ = 0;
      local_1a8.data._M_elems._32_5_ = 0;
      local_1a8.data._M_elems[9]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1a8,local_170);
      lp = local_f0;
      if (((local_168.fpclass == cpp_dec_float_NaN) || (local_1a8.fpclass == cpp_dec_float_NaN)) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_168,&local_1a8), iVar7 != 0)) {
        local_1a8.fpclass = cpp_dec_float_finite;
        local_1a8.prec_elem = 10;
        local_1a8.data._M_elems[0] = 0;
        local_1a8.data._M_elems[1] = 0;
        local_1a8.data._M_elems[2] = 0;
        local_1a8.data._M_elems[3] = 0;
        local_1a8.data._M_elems[4] = 0;
        local_1a8.data._M_elems[5] = 0;
        local_1a8.data._M_elems._24_5_ = 0;
        local_1a8.data._M_elems[7]._1_3_ = 0;
        local_1a8.data._M_elems._32_5_ = 0;
        local_1a8.data._M_elems[9]._1_3_ = 0;
        local_1a8.exp = 0;
        local_1a8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1a8,&local_128,&local_168);
        if (((local_1a8.fpclass != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1a8,&__return_storage_ptr__->m_backend), 0 < iVar7)) {
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               CONCAT35(local_1a8.data._M_elems[9]._1_3_,local_1a8.data._M_elems._32_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_1a8.data._M_elems._16_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               CONCAT35(local_1a8.data._M_elems[7]._1_3_,local_1a8.data._M_elems._24_5_);
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_1a8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_1a8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_1a8.exp;
          (__return_storage_ptr__->m_backend).neg = local_1a8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_1a8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_1a8.prec_elem;
        }
      }
      local_e8 = local_e8 + 1;
    } while (local_e8 <
             (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}